

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slaveinfo.c
# Opt level: O1

char * dtype2string(uint16 dtype)

{
  undefined8 uVar1;
  undefined6 in_register_0000003a;
  
  switch((int)CONCAT62(in_register_0000003a,dtype)) {
  case 1:
    uVar1 = 0x4e41454c4f4f42;
    goto LAB_001024d7;
  case 2:
    builtin_strncpy(hstr,"INTEGER8",9);
    break;
  case 3:
    builtin_strncpy(hstr,"INTEGER16",10);
    break;
  case 4:
    builtin_strncpy(hstr,"INTEGER32",10);
    break;
  case 5:
    builtin_strncpy(hstr,"UNSIGNED8",10);
    break;
  case 6:
    builtin_strncpy(hstr,"UNSIGNED16",0xb);
    break;
  case 7:
    builtin_strncpy(hstr,"UNSIGNED32",0xb);
    break;
  case 8:
    hstr[4] = '3';
    hstr[5] = '2';
    hstr[6] = '\0';
    goto LAB_0010245a;
  case 9:
    builtin_strncpy(hstr + 8,"STRING",7);
    uVar1 = 0x5f454c4249534956;
    goto LAB_001024d7;
  case 10:
    builtin_strncpy(hstr + 8,"RING",5);
    uVar1 = 0x54535f544554434f;
LAB_001024d7:
    hstr._0_4_ = (undefined4)uVar1;
    hstr[4] = (char)((ulong)uVar1 >> 0x20);
    hstr._5_2_ = (undefined2)((ulong)uVar1 >> 0x28);
    hstr[7] = (char)((ulong)uVar1 >> 0x38);
    break;
  default:
    sprintf(hstr,"Type 0x%4.4X",dtype);
    break;
  case 0x10:
    uVar1 = 0x3252454745544e49;
    goto LAB_0010239d;
  case 0x11:
    hstr[4] = '6';
    hstr[5] = '4';
    hstr[6] = '\0';
LAB_0010245a:
    builtin_strncpy(hstr,"REAL",4);
    break;
  case 0x15:
    uVar1 = 0x3652454745544e49;
LAB_0010239d:
    hstr._0_4_ = (undefined4)uVar1;
    hstr[4] = (char)((ulong)uVar1 >> 0x20);
    hstr._5_2_ = (undefined2)((ulong)uVar1 >> 0x28);
    hstr[7] = (char)((ulong)uVar1 >> 0x38);
    hstr[8] = '4';
    hstr[9] = '\0';
    break;
  case 0x16:
    builtin_strncpy(hstr,"UNSIGNED24",0xb);
    break;
  case 0x1b:
    builtin_strncpy(hstr,"UNSIGNED64",0xb);
    break;
  case 0x30:
    builtin_strncpy(hstr,"BIT1",5);
    break;
  case 0x31:
    builtin_strncpy(hstr,"BIT2",5);
    break;
  case 0x32:
    builtin_strncpy(hstr,"BIT3",5);
    break;
  case 0x33:
    builtin_strncpy(hstr,"BIT4",5);
    break;
  case 0x34:
    builtin_strncpy(hstr,"BIT5",5);
    break;
  case 0x35:
    builtin_strncpy(hstr,"BIT6",5);
    break;
  case 0x36:
    builtin_strncpy(hstr,"BIT7",5);
    break;
  case 0x37:
    builtin_strncpy(hstr,"BIT8",5);
  }
  return hstr;
}

Assistant:

char* dtype2string(uint16 dtype)
{
    switch(dtype)
    {
        case ECT_BOOLEAN:
            sprintf(hstr, "BOOLEAN");
            break;
        case ECT_INTEGER8:
            sprintf(hstr, "INTEGER8");
            break;
        case ECT_INTEGER16:
            sprintf(hstr, "INTEGER16");
            break;
        case ECT_INTEGER32:
            sprintf(hstr, "INTEGER32");
            break;
        case ECT_INTEGER24:
            sprintf(hstr, "INTEGER24");
            break;
        case ECT_INTEGER64:
            sprintf(hstr, "INTEGER64");
            break;
        case ECT_UNSIGNED8:
            sprintf(hstr, "UNSIGNED8");
            break;
        case ECT_UNSIGNED16:
            sprintf(hstr, "UNSIGNED16");
            break;
        case ECT_UNSIGNED32:
            sprintf(hstr, "UNSIGNED32");
            break;
        case ECT_UNSIGNED24:
            sprintf(hstr, "UNSIGNED24");
            break;
        case ECT_UNSIGNED64:
            sprintf(hstr, "UNSIGNED64");
            break;
        case ECT_REAL32:
            sprintf(hstr, "REAL32");
            break;
        case ECT_REAL64:
            sprintf(hstr, "REAL64");
            break;
        case ECT_BIT1:
            sprintf(hstr, "BIT1");
            break;
        case ECT_BIT2:
            sprintf(hstr, "BIT2");
            break;
        case ECT_BIT3:
            sprintf(hstr, "BIT3");
            break;
        case ECT_BIT4:
            sprintf(hstr, "BIT4");
            break;
        case ECT_BIT5:
            sprintf(hstr, "BIT5");
            break;
        case ECT_BIT6:
            sprintf(hstr, "BIT6");
            break;
        case ECT_BIT7:
            sprintf(hstr, "BIT7");
            break;
        case ECT_BIT8:
            sprintf(hstr, "BIT8");
            break;
        case ECT_VISIBLE_STRING:
            sprintf(hstr, "VISIBLE_STRING");
            break;
        case ECT_OCTET_STRING:
            sprintf(hstr, "OCTET_STRING");
            break;
        default:
            sprintf(hstr, "Type 0x%4.4X", dtype);
    }
    return hstr;
}